

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_host_destroy(ENetHost *host)

{
  ENetPeer *pEVar1;
  ENetPeer *peer;
  
  if (host != (ENetHost *)0x0) {
    enet_socket_destroy(host->socket);
    pEVar1 = host->peers;
    for (peer = pEVar1; peer < pEVar1 + host->peerCount; peer = peer + 1) {
      enet_peer_reset(peer);
      pEVar1 = host->peers;
    }
    (*(code *)callbacks_1)();
    (*(code *)callbacks_1)(host);
    return;
  }
  return;
}

Assistant:

void enet_host_destroy(ENetHost* host) {
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("A ENet host object is being destroyed.");

	if (host == NULL)
		return;

	enet_socket_destroy(host->socket);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		enet_peer_reset(currentPeer);
	}

	enet_free(host->peers);
	enet_free(host);
}